

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_get_var_nentry_test(void)

{
  uint64_t uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ushort *puVar6;
  bnode *pbVar7;
  btree_kv_ops *pbVar8;
  size_t i;
  char *pcVar9;
  long lVar10;
  __suseconds_t *p_Var11;
  undefined8 *puVar12;
  ulong uVar13;
  char *__ptr;
  char cVar14;
  timeval *ptVar15;
  long lStack_308;
  long lStack_300;
  timeval tStack_2f8;
  btree bStack_2e8;
  btree_kv_ops *pbStack_2b0;
  long lStack_2a8;
  char *pcStack_2a0;
  undefined2 **ppuStack_298;
  char *pcStack_290;
  undefined2 *puStack_288;
  timeval tStack_280;
  bnode *pbStack_270;
  uint64_t uStack_268;
  code *pcStack_260;
  btree_kv_ops bStack_258;
  undefined8 uStack_1e0;
  timeval tStack_1d8;
  undefined8 uStack_1c8;
  undefined1 auStack_1c0 [15];
  char cStack_1b1;
  bnode *pbStack_1b0;
  undefined2 **ppuStack_1a8;
  long *plStack_1a0;
  char *pcStack_198;
  btree_kv_ops *pbStack_190;
  void **ppvStack_188;
  long lStack_178;
  long lStack_170;
  void *pvStack_168;
  undefined2 *puStack_160;
  timeval tStack_158;
  bnode *pbStack_148;
  void *pvStack_140;
  undefined8 *puStack_138;
  btree_kv_ops *pbStack_130;
  long lStack_128;
  code *pcStack_120;
  btree_kv_ops local_118;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  timeval __test_begin;
  void *vars [2];
  void *local_40;
  void *k_out;
  uint8_t v_out;
  uint8_t v;
  undefined7 uVar16;
  
  lVar10 = 0;
  uStack_a0 = 0x103602;
  gettimeofday((timeval *)local_98,(__timezone_ptr_t)0x0);
  uStack_a0 = 0x103607;
  memleak_start();
  local_40 = (void *)0x0;
  puVar12 = &DAT_00109d70;
  do {
    pcVar9 = *(char **)((long)&DAT_00109d70 + lVar10);
    uStack_a0 = 0x103622;
    sVar5 = strlen(pcVar9);
    uVar3 = (int)sVar5 + 1;
    uVar13 = (ulong)(uVar3 & 0xffff);
    uStack_a0 = 0x103631;
    puVar6 = (ushort *)malloc(uVar13 + 2);
    uVar2 = (ushort)uVar3;
    *puVar6 = uVar2 << 8 | uVar2 >> 8;
    uStack_a0 = 0x10364e;
    memcpy(puVar6 + 1,pcVar9,uVar13);
    *(ushort **)((long)&__test_begin.tv_usec + lVar10) = puVar6;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x30);
  uStack_a0 = 0x103667;
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0x901;
  pbVar7->level = 1;
  pbVar7->nentry = 6;
  (pbVar7->field_4).data = pbVar7 + 1;
  k_out._7_1_ = 'd';
  pcStack_120 = (code *)0x10369d;
  btree_str_kv_get_kb64_vb64(&local_118);
  p_Var11 = &__test_begin.tv_usec;
  lVar10 = 0;
  do {
    pcStack_120 = (code *)0x1036b6;
    (*local_118.set_kv)(pbVar7,(idx_t)lVar10,p_Var11,(void *)((long)&k_out + 7));
    k_out._7_1_ = k_out._7_1_ + '\x01';
    lVar10 = lVar10 + 1;
    p_Var11 = p_Var11 + 1;
  } while (lVar10 != 6);
  k_out._7_1_ = 'd';
  lVar10 = 0;
  while( true ) {
    pcStack_120 = (code *)0x1036e2;
    (*local_118.get_kv)(pbVar7,(idx_t)lVar10,&local_40,(void *)((long)&k_out + 6));
    pcStack_120 = (code *)0x1036f3;
    iVar4 = strcmp((char *)((long)local_40 + 2),(char *)*puVar12);
    if (iVar4 != 0) break;
    if (k_out._6_1_ != k_out._7_1_) {
      pcStack_120 = (code *)0x103799;
      kv_get_var_nentry_test();
      break;
    }
    k_out._7_1_ = k_out._7_1_ + '\x01';
    lVar10 = lVar10 + 1;
    puVar12 = puVar12 + 1;
    if (lVar10 == 6) {
      vars[0] = local_40;
      lVar10 = 0;
      do {
        pcStack_120 = (code *)0x103731;
        free(vars[lVar10 + -1]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 2);
      lVar10 = 0;
      do {
        pcStack_120 = (code *)0x103746;
        free((void *)(&__test_begin.tv_usec)[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      pcStack_120 = (code *)0x103754;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_120 = (code *)0x103785;
      fprintf(_stderr,pcVar9,"kv_get_var_nentry_test");
      return;
    }
  }
  pcStack_120 = kv_ins_var;
  kv_get_var_nentry_test();
  ppvStack_188 = (void **)0x1037b8;
  pbStack_148 = pbVar7;
  pvStack_140 = (void *)((long)&k_out + 6);
  puStack_138 = puVar12;
  pbStack_130 = &local_118;
  lStack_128 = lVar10;
  pcStack_120 = (code *)&stack0xfffffffffffffff8;
  gettimeofday(&tStack_158,(__timezone_ptr_t)0x0);
  ppvStack_188 = (void **)0x1037bd;
  memleak_start();
  ppvStack_188 = (void **)0x1037c7;
  puStack_160 = (undefined2 *)malloc(0xd);
  *puStack_160 = 0xb00;
  *(undefined8 *)(puStack_160 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_160 + 9) = 0x676e69;
  ppvStack_188 = (void **)0x1037fb;
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0xd08;
  pbVar7->level = 1;
  (pbVar7->field_4).data = pbVar7 + 1;
  lStack_170 = 0x14;
  pvStack_168 = (void *)0x0;
  ppvStack_188 = (void **)0x103838;
  pbVar8 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  ppvStack_188 = (void **)0x103849;
  (*pbVar8->ins_kv)(pbVar7,0,&puStack_160,&lStack_170);
  ppvStack_188 = (void **)0x103859;
  (*pbVar8->get_kv)(pbVar7,0,&pvStack_168,&lStack_178);
  ppvStack_188 = (void **)0x103869;
  iVar4 = strcmp((char *)((long)pvStack_168 + 2),"teststring");
  if (iVar4 == 0) {
    if (lStack_178 == lStack_170) {
      ppvStack_188 = (void **)0x103881;
      free(pbVar7);
      ppvStack_188 = (void **)0x103889;
      free(pbVar8);
      ppvStack_188 = (void **)0x103893;
      free(puStack_160);
      ppvStack_188 = (void **)0x10389d;
      free(pvStack_168);
      ppvStack_188 = (void **)0x1038a2;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (kv_ins_var()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      ppvStack_188 = (void **)0x1038d3;
      fprintf(_stderr,pcVar9,"kv_ins_var");
      return;
    }
  }
  else {
    ppvStack_188 = (void **)0x1038e7;
    kv_ins_var();
  }
  ppvStack_188 = (void **)kv_ins_var_nentry_test;
  kv_ins_var();
  pcStack_198 = "teststring";
  ptVar15 = &tStack_1d8;
  lVar10 = 0;
  uStack_1e0 = 0x10390b;
  pbStack_1b0 = pbVar7;
  ppuStack_1a8 = &puStack_160;
  plStack_1a0 = &lStack_170;
  pbStack_190 = pbVar8;
  ppvStack_188 = &pvStack_168;
  gettimeofday(&tStack_1d8,(__timezone_ptr_t)0x0);
  uStack_1e0 = 0x103910;
  memleak_start();
  do {
    pcVar9 = *(char **)((long)&DAT_00109d60 + lVar10);
    uStack_1e0 = 0x103923;
    sVar5 = strlen(pcVar9);
    uVar3 = (int)sVar5 + 1;
    uVar13 = (ulong)(uVar3 & 0xffff);
    uStack_1e0 = 0x103932;
    puVar6 = (ushort *)malloc(uVar13 + 2);
    uVar2 = (ushort)uVar3;
    *puVar6 = uVar2 << 8 | uVar2 >> 8;
    uStack_1e0 = 0x10394f;
    memcpy(puVar6 + 1,pcVar9,uVar13);
    *(ushort **)((long)&uStack_1c8 + lVar10) = puVar6;
    lVar10 = lVar10 + 8;
  } while (lVar10 == 8);
  uStack_1e0 = 0x103968;
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0x901;
  pbVar7->level = 1;
  pbVar7->nentry = 2;
  (pbVar7->field_4).data = pbVar7 + 1;
  cStack_1b1 = 'd';
  pcStack_260 = (code *)0x10399c;
  btree_str_kv_get_kb64_vb64(&bStack_258);
  pcStack_260 = (code *)0x1039ac;
  (*bStack_258.ins_kv)(pbVar7,0,&uStack_1c8,&cStack_1b1);
  cStack_1b1 = cStack_1b1 + '\x01';
  pcStack_260 = (code *)0x1039bf;
  (*bStack_258.ins_kv)(pbVar7,0,auStack_1c0,&cStack_1b1);
  uVar1 = (pbVar7->field_4).dummy;
  pcStack_260 = (code *)0x1039d3;
  iVar4 = strcmp((char *)(uVar1 + 2),"longstring");
  if (iVar4 == 0) {
    uVar16 = (undefined7)((ulong)&tStack_1d8 >> 8);
    ptVar15 = (timeval *)CONCAT71(uVar16,cStack_1b1);
    if (*(char *)(uVar1 + 0xd) != cStack_1b1) goto LAB_00103a2a;
    cVar14 = cStack_1b1 + -1;
    ptVar15 = (timeval *)CONCAT71(uVar16,cVar14);
    pcStack_260 = (code *)0x1039f8;
    cStack_1b1 = cVar14;
    iVar4 = strcmp((char *)(uVar1 + 0x10),"string");
    if (iVar4 == 0) {
      if (*(char *)(uVar1 + 0x17) == cVar14) {
        pcStack_260 = (code *)0x103a16;
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_00103a34;
    }
  }
  else {
    pcStack_260 = (code *)0x103a2a;
    kv_ins_var_nentry_test();
LAB_00103a2a:
    pcStack_260 = (code *)0x103a2f;
    kv_ins_var_nentry_test();
  }
  pcStack_260 = (code *)0x103a34;
  kv_ins_var_nentry_test();
LAB_00103a34:
  pcStack_260 = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  ppuStack_298 = (undefined2 **)0x103a4e;
  pbStack_270 = pbVar7;
  uStack_268 = uVar1;
  pcStack_260 = (code *)ptVar15;
  gettimeofday(&tStack_280,(__timezone_ptr_t)0x0);
  ppuStack_298 = (undefined2 **)0x103a53;
  memleak_start();
  pcStack_290 = (char *)0x0;
  ppuStack_298 = (undefined2 **)0x103a64;
  pbVar8 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  ppuStack_298 = (undefined2 **)0x103a71;
  puStack_288 = (undefined2 *)malloc(0xd);
  *puStack_288 = 0xb00;
  *(undefined8 *)(puStack_288 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_288 + 9) = 0x676e69;
  pcVar9 = "teststring";
  ppuStack_298 = (undefined2 **)0x103aa2;
  (*pbVar8->set_key)((btree *)0x0,&pcStack_290,&puStack_288);
  __ptr = pcStack_290;
  ppuStack_298 = (undefined2 **)0x103ab1;
  iVar4 = strcmp(pcStack_290 + 2,"teststring");
  if (iVar4 == 0) {
    ppuStack_298 = (undefined2 **)0x103abd;
    free(__ptr);
    ppuStack_298 = (undefined2 **)0x103ac7;
    pcStack_290 = (char *)malloc(0x15);
    pcStack_290[0] = '\0';
    pcStack_290[1] = '\x13';
    pcStack_290[2] = 'u';
    pcStack_290[3] = 'p';
    pcStack_290[4] = 'd';
    pcStack_290[5] = 'a';
    pcStack_290[6] = 't';
    pcStack_290[7] = 'e';
    pcStack_290[8] = 'd';
    pcStack_290[9] = ' ';
    pcStack_290[10] = 't';
    pcStack_290[0xb] = 'e';
    pcStack_290[0xc] = 's';
    pcStack_290[0xd] = 't';
    pcStack_290[0xe] = 's';
    pcStack_290[0xf] = 't';
    pcStack_290[0x10] = 'r';
    pcStack_290[0x11] = 'i';
    pcStack_290[0x11] = 'i';
    pcStack_290[0x12] = 'n';
    pcStack_290[0x13] = 'g';
    pcStack_290[0x14] = '\0';
    __ptr = "updated teststring";
    pcVar9 = (char *)&puStack_288;
    ppuStack_298 = (undefined2 **)0x103af8;
    (*pbVar8->set_key)((btree *)0x0,pcVar9,&pcStack_290);
    ppuStack_298 = (undefined2 **)0x103b07;
    iVar4 = strcmp((char *)(puStack_288 + 1),"updated teststring");
    if (iVar4 == 0) {
      ppuStack_298 = (undefined2 **)0x103b20;
      kv_set_str_key_test();
      return;
    }
  }
  else {
    ppuStack_298 = (undefined2 **)0x103b2f;
    kv_set_str_key_test();
  }
  ppuStack_298 = (undefined2 **)kv_set_str_value_test;
  kv_set_str_key_test();
  pbStack_2b0 = pbVar8;
  lStack_2a8 = lVar10;
  pcStack_2a0 = __ptr;
  ppuStack_298 = (undefined2 **)pcVar9;
  gettimeofday(&tStack_2f8,(__timezone_ptr_t)0x0);
  memleak_start();
  lStack_308 = 100;
  bStack_2e8.vsize = '\b';
  pbVar8 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  (*pbVar8->set_value)(&bStack_2e8,&lStack_308,&lStack_300);
  if (lStack_308 != lStack_300) {
    kv_set_str_value_test();
  }
  lStack_300 = 200;
  (*pbVar8->set_value)(&bStack_2e8,&lStack_300,&lStack_308);
  if (lStack_308 != lStack_300) {
    kv_set_str_value_test();
  }
  free(pbVar8);
  memleak_end();
  pcVar9 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar9 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar9,"kv_set_str_value_test");
  return;
}

Assistant:

void kv_get_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v, v_out;
    idx_t idx;
    int cmp, i;
    void *k_out = NULL;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, &k_out, (void *)&v_out);
        char *node_str = (char *)((uint8_t *)k_out + sizeof(key_len_t));
        cmp = strcmp(node_str, keys[idx]);
        TEST_CHK(cmp == 0);
        cmp = memcmp(&v_out, &v, vsize);
        TEST_CHK(cmp == 0);
        v++;
    }


    void *vars[] = {(void *)node, k_out};
    freevars(vars, sizeof(vars)/sizeof(void *));
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}